

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionController::CalculateSimpleFee
          (ConfidentialTransactionController *this,bool append_feature_signed_size,
          bool append_signed_witness)

{
  uint32_t size;
  uint32_t vsize;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  size = cfd::core::ConfidentialTransaction::GetTotalSize();
  vsize = cfd::core::ConfidentialTransaction::GetVsize();
  if ((int)CONCAT71(in_register_00000031,append_feature_signed_size) != 0) {
    iVar1 = cfd::core::ConfidentialTransaction::GetWeight();
    iVar2 = cfd::core::ConfidentialTransaction::GetTxInCount();
    iVar3 = 0x1b0;
    if (append_signed_witness) {
      iVar3 = 0x6c;
    }
    size = size + iVar3 * iVar2;
    vsize = iVar1 + iVar3 * iVar2 + 3U >> 2;
  }
  FeeCalculator::CalculateFee(size,vsize,1000);
  return;
}

Assistant:

Amount ConfidentialTransactionController::CalculateSimpleFee(
    bool append_feature_signed_size, bool append_signed_witness) const {
  static constexpr uint32_t kP2wpkhWitnessSize = 72 + 33 + 3;
  // 簡易計算
  uint32_t size = transaction_.GetTotalSize();
  uint32_t vsize = transaction_.GetVsize();
  uint32_t rate = FeeCalculator::kRelayMinimumFee;
  if (append_feature_signed_size) {
    uint32_t weight = transaction_.GetWeight();
    uint32_t count = transaction_.GetTxInCount();
    uint32_t add_size;
    add_size = kP2wpkhWitnessSize * count;
    if (!append_signed_witness) {
      // no segwit (x4)
      add_size *= 4;
    }
    size += add_size;
    weight += add_size;
    vsize = (weight + 3) / 4;  // wally_tx_vsize_from_weight
  }
  return FeeCalculator::CalculateFee(size, vsize, rate);
}